

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void __thiscall cmQtAutoGenInitializer::InfoWriter::WriteUInt(InfoWriter *this,char *key,uint value)

{
  ostream *poVar1;
  uint value_local;
  char *key_local;
  InfoWriter *this_local;
  
  poVar1 = std::operator<<((ostream *)this,"set(");
  poVar1 = std::operator<<(poVar1,key);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,value);
  std::operator<<(poVar1,")\n");
  return;
}

Assistant:

void cmQtAutoGenInitializer::InfoWriter::WriteUInt(const char* key,
                                                   unsigned int value)
{
  Ofs_ << "set(" << key << " " << value << ")\n";
}